

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_context.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::SourceContext::_InternalSerialize
          (SourceContext *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  SourceContext *this_00;
  bool bVar1;
  uint uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  WireFormatLite *this_01;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string *local_38;
  string *_s;
  SourceContext *pSStack_28;
  uint32_t cached_has_bits;
  SourceContext *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  SourceContext *this_local;
  
  _s._4_4_ = 0;
  pSStack_28 = this;
  this_ = (SourceContext *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar3 & 1) != 0) {
    _internal_file_name_abi_cxx11_(pSStack_28);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_38 = _internal_file_name_abi_cxx11_(pSStack_28);
      this_01 = (WireFormatLite *)std::__cxx11::string::data();
      uVar2 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,"google.protobuf.SourceContext.file_name");
      sVar5._M_str = in_R9;
      sVar5._M_len = (size_t)local_48._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (this_01,(char *)(ulong)uVar2,1,(Operation)local_48._M_len,sVar5);
      this_00 = this_;
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)this_00,1,sVar5,(uint8_t *)stream_local);
    }
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(pSStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pSStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL SourceContext::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const SourceContext& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceContext)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // string file_name = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._internal_file_name().empty()) {
      const ::std::string& _s = this_._internal_file_name();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.SourceContext.file_name");
      target = stream->WriteStringMaybeAliased(1, _s, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceContext)
  return target;
}